

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataReader.h
# Opt level: O1

void __thiscall
anurbs::DataReader::fill_vector<Eigen::Matrix<double,1,3,1,1,3>>
          (DataReader *this,string *key,Matrix<double,_1,_3,_1,_1,_3> *vector)

{
  const_reference pvVar1;
  ulong uVar2;
  size_type idx;
  value_type data;
  double ret;
  undefined1 local_38 [8];
  json_value local_30;
  double local_28;
  
  pvVar1 = nlohmann::
           basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at(this->m_data,key);
  nlohmann::
  basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_38,pvVar1);
  uVar2 = (ulong)local_38[0];
  if (local_38[0] != null) {
    if (local_38[0] == object) {
      uVar2 = ((local_30.object)->m_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    }
    else if (local_38[0] == array) {
      uVar2 = (long)(((local_30.object)->m_keys)._M_h._M_bucket_count -
                    (long)((local_30.object)->m_keys)._M_h._M_buckets) >> 4;
    }
    else {
      uVar2 = 1;
    }
  }
  if (uVar2 == 3) {
    idx = 0;
    while( true ) {
      uVar2 = (ulong)local_38[0];
      if (local_38[0] != null) {
        if (local_38[0] == object) {
          uVar2 = ((local_30.object)->m_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
        }
        else if (local_38[0] == array) {
          uVar2 = (long)(((local_30.object)->m_keys)._M_h._M_bucket_count -
                        (long)((local_30.object)->m_keys)._M_h._M_buckets) >> 4;
        }
        else {
          uVar2 = 1;
        }
      }
      if ((long)uVar2 <= (long)idx) break;
      pvVar1 = nlohmann::
               basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::at((basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)local_38,idx);
      nlohmann::detail::
      get_arithmetic_value<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_double,_0>
                (pvVar1,&local_28);
      if (idx == 3) {
        __assert_fail("index >= 0 && index < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0x198,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, 1, 3>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, 1, 3>, Level = 1]"
                     );
      }
      (vector->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
      [idx] = local_28;
      idx = idx + 1;
    }
    nlohmann::
    basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_38);
    nlohmann::
    basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_38 + 8),local_38[0]);
    return;
  }
  __assert_fail("data.size() == vector.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/include/anurbs/Algorithm/../Geometry/../Model/DataReader.h"
                ,0x33,
                "void anurbs::DataReader::fill_vector(const std::string &, T) const [T = Eigen::Matrix<double, 1, 3>]"
               );
}

Assistant:

void fill_vector(const std::string& key, T vector) const
    {
        const auto data = m_data.at(key);
        
        assert(data.size() == vector.size());

        for (Index i = 0; i < length(data); i++) {
            vector[i] = data.at(i);
        }
    }